

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O3

int cram_add_base(cram_fd *fd,cram_container *c,cram_slice *s,cram_record *r,int pos,char base,
                 char qual)

{
  int iVar1;
  void *__ptr;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t __size;
  long lVar5;
  undefined3 in_register_00000089;
  undefined1 auVar6 [16];
  double dVar7;
  anon_union_16_11_96f556d8_for_cram_feature_0 local_38;
  
  local_38.X.pos = (int)r + 1;
  local_38.X.code = 0x42;
  local_38.X.base = pos;
  local_38.B.qual = CONCAT31(in_register_00000089,base);
  cram_stats_add((cram_stats *)fd->m[0x26],pos);
  cram_stats_add((cram_stats *)fd->m[0x14],CONCAT31(in_register_00000089,base));
  lVar4 = *(long *)&c->last_pos;
  __ptr = *(void **)(lVar4 + 0x20);
  uVar2 = *(ulong *)(lVar4 + 0x28);
  lVar5 = *(long *)(lVar4 + 0x30);
  uVar3 = lVar5 + 1;
  if (uVar2 <= uVar3) {
    do {
      auVar6._8_4_ = (int)(uVar2 >> 0x20);
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = 0x45300000;
      dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
      uVar3 = (ulong)dVar7;
      __size = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      if (uVar2 == 0) {
        __size = 0x400;
      }
      *(size_t *)(lVar4 + 0x28) = __size;
      __ptr = realloc(__ptr,__size);
      lVar4 = *(long *)&c->last_pos;
      *(void **)(lVar4 + 0x20) = __ptr;
      uVar2 = *(ulong *)(lVar4 + 0x28);
      lVar5 = *(long *)(lVar4 + 0x30);
      uVar3 = lVar5 + 1;
    } while (uVar2 <= uVar3);
  }
  *(ulong *)(lVar4 + 0x30) = uVar3;
  *(char *)((long)__ptr + lVar5) = base;
  iVar1 = cram_add_feature((cram_container *)fd,(cram_slice *)c,(cram_record *)s,
                           (cram_feature *)&local_38.X);
  return iVar1;
}

Assistant:

static int cram_add_base(cram_fd *fd, cram_container *c,
			 cram_slice *s, cram_record *r,
			 int pos, char base, char qual) {
    cram_feature f;
    f.B.pos = pos+1;
    f.B.code = 'B';
    f.B.base = base;
    f.B.qual = qual;
    cram_stats_add(c->stats[DS_BA], base);
    cram_stats_add(c->stats[DS_QS], qual);
    BLOCK_APPEND_CHAR(s->qual_blk, qual);
    return cram_add_feature(c, s, r, &f);
}